

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_tree.cpp
# Opt level: O0

uchar __thiscall node_t::first_byte_at(node_t *this,size_t index_)

{
  uint32_t uVar1;
  uchar *puVar2;
  node_t *in_RSI;
  node_t *in_RDI;
  node_t *this_00;
  
  this_00 = in_RSI;
  uVar1 = edgecount(in_RDI);
  if ((node_t *)(ulong)uVar1 <= this_00) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","index_ < edgecount ()",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/radix_tree.cpp"
            ,0x66);
    fflush(_stderr);
    zmq::zmq_abort((char *)0x23dc7a);
  }
  puVar2 = first_bytes(this_00);
  return puVar2[(long)in_RSI];
}

Assistant:

unsigned char node_t::first_byte_at (size_t index_)
{
    zmq_assert (index_ < edgecount ());
    return first_bytes ()[index_];
}